

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

void helper_mttc0_debug_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  CPUMIPSState_conflict5 *pCVar1;
  CPUMIPSState_conflict5 *other;
  uint32_t val;
  int other_tc;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  other._0_4_ = (uint)arg1 & 0x4000100;
  _val = arg1;
  arg1_local = (target_ulong)env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  if (other._4_4_ == pCVar1->current_tc) {
    (pCVar1->active_tc).CP0_Debug_tcstatus = (uint)other;
  }
  else {
    pCVar1->tcs[(int)other._4_4_].CP0_Debug_tcstatus = (uint)other;
  }
  pCVar1->CP0_Debug = pCVar1->CP0_Debug & 0x4000100U | (uint)_val & 0xfbfffeff;
  return;
}

Assistant:

void helper_mttc0_debug(CPUMIPSState *env, target_ulong arg1)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    uint32_t val = arg1 & ((1 << CP0DB_SSt) | (1 << CP0DB_Halt));
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    /* XXX: Might be wrong, check with EJTAG spec. */
    if (other_tc == other->current_tc) {
        other->active_tc.CP0_Debug_tcstatus = val;
    } else {
        other->tcs[other_tc].CP0_Debug_tcstatus = val;
    }
    other->CP0_Debug = (other->CP0_Debug &
                     ((1 << CP0DB_SSt) | (1 << CP0DB_Halt))) |
                     (arg1 & ~((1 << CP0DB_SSt) | (1 << CP0DB_Halt)));
}